

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_graph_reset(ggml_cgraph *cgraph)

{
  ggml_tensor *node;
  _Bool _Var1;
  undefined8 in_RAX;
  ggml_tensor *tensor;
  char *pcVar2;
  long lVar3;
  int line;
  undefined4 uStack_38;
  float onef;
  
  _uStack_38 = in_RAX;
  if (cgraph->grads == (ggml_tensor **)0x0) {
    pcVar2 = "cgraph->grads != NULL";
    line = 0x17bc;
LAB_001278cc:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
               "GGML_ASSERT(%s) failed",pcVar2);
  }
  lVar3 = 0;
  do {
    if (cgraph->n_nodes <= lVar3) {
      return;
    }
    node = cgraph->nodes[lVar3];
    tensor = ggml_graph_get_grad_acc(cgraph,node);
    if (node->op == GGML_OP_OPT_STEP_ADAMW) {
      ggml_set_zero(node->src[2]);
      ggml_set_zero(node->src[3]);
    }
    if (tensor != (ggml_tensor *)0x0) {
      if ((node->flags & 8) == 0) {
        ggml_set_zero(tensor);
      }
      else {
        if (tensor->type != GGML_TYPE_F32) {
          pcVar2 = "grad_acc->type == GGML_TYPE_F32";
          line = 0x17cb;
          goto LAB_001278cc;
        }
        _Var1 = ggml_is_scalar(tensor);
        if (!_Var1) {
          pcVar2 = "ggml_is_scalar(grad_acc)";
          line = 0x17cc;
          goto LAB_001278cc;
        }
        _uStack_38 = CONCAT44(0x3f800000,uStack_38);
        if (tensor->buffer == (ggml_backend_buffer *)0x0) {
          if ((undefined4 *)tensor->data == (undefined4 *)0x0) {
            pcVar2 = "grad_acc->data";
            line = 0x17d2;
            goto LAB_001278cc;
          }
          *(undefined4 *)tensor->data = 0x3f800000;
        }
        else {
          ggml_backend_tensor_set(tensor,&onef,0,4);
        }
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void ggml_graph_reset(struct ggml_cgraph * cgraph) {
    GGML_ASSERT(cgraph->grads != NULL);

    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * node     = cgraph->nodes[i];
        struct ggml_tensor * grad_acc = ggml_graph_get_grad_acc(cgraph, node);

        if (node->op == GGML_OP_OPT_STEP_ADAMW) {
            // clear momenta
            ggml_set_zero(node->src[2]);
            ggml_set_zero(node->src[3]);
        }

        // initial gradients of loss should be 1, 0 otherwise
        if (grad_acc) {
            if (node->flags & GGML_TENSOR_FLAG_LOSS) {
                GGML_ASSERT(grad_acc->type == GGML_TYPE_F32);
                GGML_ASSERT(ggml_is_scalar(grad_acc));

                const float onef = 1.0f;
                if (grad_acc->buffer) {
                    ggml_backend_tensor_set(grad_acc, &onef, 0, sizeof(float));
                } else {
                    GGML_ASSERT(grad_acc->data);
                    *((float *) grad_acc->data) = onef;
                }
            } else {
                ggml_set_zero(grad_acc);
            }
        }
    }
}